

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

socket_t __thiscall
UrsaClient::setup_connection::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  void *extraout_RDX;
  undefined8 *in_RSI;
  socket_base in_RDI;
  socket_t sVar1;
  socket_t *socket;
  int in_stack_ffffffffffffffbc;
  int __fd;
  context_t *context_;
  socket_t *this_00;
  
  context_ = (context_t *)*in_RSI;
  this_00 = (socket_t *)in_RDI._handle;
  zmq::socket_t::socket_t((socket_t *)in_RDI._handle,context_,(int)((ulong)in_RDI._handle >> 0x20));
  __fd = (int)context_;
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)in_RDI._handle,in_stack_ffffffffffffffbc,(int *)0x120d97);
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)in_RDI._handle,in_stack_ffffffffffffffbc,(int *)0x120db5);
  zmq::detail::socket_base::connect(&this_00->super_socket_base,__fd,__addr,in_ECX);
  sVar1.ctxptr = extraout_RDX;
  sVar1.super_socket_base._handle = in_RDI._handle;
  return sVar1;
}

Assistant:

void UrsaClient::setup_connection() {
    auto make_socket = [this]() {
        zmq::socket_t socket(context, ZMQ_REQ);
        socket.setsockopt(ZMQ_LINGER, 0);
        socket.setsockopt(ZMQ_RCVTIMEO, 1000);
        socket.connect(server_addr);
        return socket;
    };

    if (is_interactive) {
        spdlog::info("Connecting to {}", server_addr);
    }
    cmd_socket = make_socket();
    check_conn_status(&cmd_socket);
    status_socket = make_socket();
}